

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcBinaryStream.h
# Opt level: O0

unsigned_long __thiscall
o3dgc::BinaryStream::ReadUInt32
          (BinaryStream *this,unsigned_long *position,O3DGCStreamType streamType)

{
  undefined8 local_28;
  unsigned_long value;
  O3DGCStreamType streamType_local;
  unsigned_long *position_local;
  BinaryStream *this_local;
  
  if (streamType == O3DGC_STREAM_TYPE_ASCII) {
    local_28 = ReadUInt32ASCII(this,position);
  }
  else {
    local_28 = ReadUInt32Bin(this,position);
  }
  return local_28;
}

Assistant:

unsigned long           ReadUInt32(unsigned long & position, O3DGCStreamType streamType) const
                                {
                                    unsigned long value;
                                    if (streamType == O3DGC_STREAM_TYPE_ASCII)
                                    {
                                        value = ReadUInt32ASCII(position);
                                    }
                                    else
                                    {
                                        value = ReadUInt32Bin(position);
                                    }
                                    return value;
                                }